

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# double.cc
# Opt level: O1

int __thiscall
AddForm::verify(AddForm *this,EVP_PKEY_CTX *ctx,uchar *sig,size_t siglen,uchar *tbs,size_t tbslen)

{
  pointer ppVVar1;
  byte *pbVar2;
  Varnode *pVVar3;
  Varnode *pVVar4;
  bool bVar5;
  uint uVar6;
  ulong uVar7;
  PcodeOp *pPVar8;
  long lVar9;
  Varnode *pVVar10;
  ulong uVar11;
  ulong uVar12;
  int iVar13;
  _List_node_base *p_Var14;
  bool bVar15;
  uint uVar16;
  bool local_39;
  
  this->hi1 = (Varnode *)ctx;
  this->lo1 = (Varnode *)sig;
  uVar7 = (ulong)(*(long *)(siglen + 0x58) - *(long *)(siglen + 0x50)) >> 3;
  uVar16 = 0;
  uVar11 = 0;
  uVar6 = (uint)uVar7;
  if (0 < (int)uVar6) {
    uVar11 = 0;
    do {
      if (*(EVP_PKEY_CTX **)(*(long *)(siglen + 0x50) + uVar11 * 8) == ctx) goto LAB_002dcf32;
      uVar11 = uVar11 + 1;
    } while ((uVar6 & 0x7fffffff) != uVar11);
    uVar11 = uVar7 & 0xffffffff;
  }
LAB_002dcf32:
  this->slot1 = (int4)uVar11;
  local_39 = true;
  do {
    if (uVar16 == 1) {
      pbVar2 = *(byte **)(*(long *)(siglen + 0x50) + (1 - (long)this->slot1) * 8);
      if ((*pbVar2 & 0x10) != 0) {
        pPVar8 = *(PcodeOp **)(pbVar2 + 0x20);
        this->add2 = pPVar8;
        if (pPVar8->opcode->opcode == CPUI_INT_ADD) {
          this->reshi = *(Varnode **)(siglen + 0x48);
          ppVVar1 = (pPVar8->inrefs).super__Vector_base<Varnode_*,_std::allocator<Varnode_*>_>.
                    _M_impl.super__Vector_impl_data._M_start;
          this->hizext1 = *ppVVar1;
          pVVar10 = ppVVar1[1];
          goto LAB_002dd090;
        }
      }
    }
    else {
      if (uVar16 == 0) {
        pPVar8 = Varnode::loneDescend(*(Varnode **)(siglen + 0x48));
        this->add2 = pPVar8;
        if ((pPVar8 == (PcodeOp *)0x0) || (pPVar8->opcode->opcode != CPUI_INT_ADD))
        goto LAB_002dd24d;
        this->reshi = pPVar8->output;
        this->hizext1 = *(Varnode **)(*(long *)(siglen + 0x50) + (1 - (long)this->slot1) * 8);
        ppVVar1 = (pPVar8->inrefs).super__Vector_base<Varnode_*,_std::allocator<Varnode_*>_>._M_impl
                  .super__Vector_impl_data._M_start;
        uVar7 = (ulong)((long)(pPVar8->inrefs).
                              super__Vector_base<Varnode_*,_std::allocator<Varnode_*>_>._M_impl.
                              super__Vector_impl_data._M_finish - (long)ppVVar1) >> 3;
        uVar6 = (uint)uVar7;
        if ((int)uVar6 < 1) {
          lVar9 = 8;
        }
        else {
          uVar11 = 0;
          do {
            uVar12 = uVar11;
            if (ppVVar1[uVar11] == *(Varnode **)(siglen + 0x48)) break;
            uVar11 = uVar11 + 1;
            uVar12 = uVar7;
          } while ((uVar6 & 0x7fffffff) != uVar11);
          lVar9 = (long)(0x100000000 - (uVar12 << 0x20)) >> 0x1d;
        }
        pVVar10 = *(Varnode **)((long)ppVVar1 + lVar9);
LAB_002dd090:
        this->hizext2 = pVVar10;
      }
      else {
        this->reshi = *(Varnode **)(siglen + 0x48);
        this->hizext1 = *(Varnode **)(*(long *)(siglen + 0x50) + (1 - (long)this->slot1) * 8);
        this->hizext2 = (Varnode *)0x0;
      }
      bVar15 = false;
      iVar13 = 0;
      do {
        if (uVar16 == 2) {
          if ((this->hizext1->flags & 0x10) == 0) goto LAB_002dd23c;
          this->zextop = this->hizext1->def;
          this->hi2 = (Varnode *)0x0;
LAB_002dd10c:
          bVar5 = checkForCarry(this,this->zextop);
          if (bVar5) {
            pVVar10 = this->lo1;
            p_Var14 = (pVVar10->descend).super__List_base<PcodeOp_*,_std::allocator<PcodeOp_*>_>.
                      _M_impl._M_node.super__List_node_base._M_next;
            bVar5 = p_Var14 == (_List_node_base *)&pVVar10->descend;
            if (!bVar5) {
              pVVar3 = this->lo2;
              do {
                pPVar8 = (PcodeOp *)p_Var14[1]._M_next;
                this->loadd = pPVar8;
                p_Var14 = p_Var14->_M_next;
                if (pPVar8->opcode->opcode == CPUI_INT_ADD) {
                  ppVVar1 = (pPVar8->inrefs).
                            super__Vector_base<Varnode_*,_std::allocator<Varnode_*>_>._M_impl.
                            super__Vector_impl_data._M_start;
                  uVar7 = (ulong)((long)(pPVar8->inrefs).
                                        super__Vector_base<Varnode_*,_std::allocator<Varnode_*>_>.
                                        _M_impl.super__Vector_impl_data._M_finish - (long)ppVVar1)
                          >> 3;
                  uVar6 = (uint)uVar7;
                  if ((int)uVar6 < 1) {
                    lVar9 = 8;
                  }
                  else {
                    uVar11 = 0;
                    do {
                      uVar12 = uVar11;
                      if (ppVVar1[uVar11] == pVVar10) break;
                      uVar11 = uVar11 + 1;
                      uVar12 = uVar7;
                    } while ((uVar6 & 0x7fffffff) != uVar11);
                    lVar9 = (long)(0x100000000 - (uVar12 << 0x20)) >> 0x1d;
                  }
                  pVVar4 = *(Varnode **)((long)ppVVar1 + lVar9);
                  if (pVVar3 == (Varnode *)0x0) {
                    if (((pVVar4->flags & 2) != 0) && ((pVVar4->loc).offset == this->negconst)) {
                      this->lo2 = pVVar4;
                      goto LAB_002dd22f;
                    }
                  }
                  else if ((pVVar3->flags & 2) == 0) {
                    if ((int)uVar6 < 1) {
                      lVar9 = 8;
                    }
                    else {
                      uVar11 = 0;
                      do {
                        uVar12 = uVar11;
                        if (ppVVar1[uVar11] == pVVar10) break;
                        uVar11 = uVar11 + 1;
                        uVar12 = uVar7;
                      } while ((uVar6 & 0x7fffffff) != uVar11);
                      lVar9 = (long)(0x100000000 - (uVar12 << 0x20)) >> 0x1d;
                    }
                    if (*(Varnode **)((long)ppVVar1 + lVar9) == pVVar3) {
LAB_002dd22f:
                      pVVar10 = pPVar8->output;
                      this->reslo = pVVar10;
                      if (!bVar5) {
                        if (bVar15) goto LAB_002dd24d;
                        goto LAB_002dd26e;
                      }
                      break;
                    }
                  }
                  else if (((pVVar4->flags & 2) != 0) &&
                          ((pVVar3->loc).offset == (pVVar4->loc).offset)) goto LAB_002dd22f;
                }
                bVar5 = p_Var14 == (_List_node_base *)&pVVar10->descend;
              } while (!bVar5);
            }
          }
        }
        else if (iVar13 == 0) {
          if ((this->hizext1->flags & 0x10) != 0) {
            this->zextop = this->hizext1->def;
            pVVar10 = this->hizext2;
            goto LAB_002dd108;
          }
        }
        else if ((this->hizext2->flags & 0x10) != 0) {
          this->zextop = this->hizext2->def;
          pVVar10 = this->hizext1;
LAB_002dd108:
          this->hi2 = pVVar10;
          goto LAB_002dd10c;
        }
LAB_002dd23c:
        bVar5 = iVar13 == 0;
        bVar15 = !bVar5;
        iVar13 = iVar13 + 1;
      } while (bVar5);
    }
LAB_002dd24d:
    local_39 = uVar16 < 2;
    uVar16 = uVar16 + 1;
    pVVar10 = (Varnode *)(ulong)uVar16;
    if (uVar16 == 3) {
LAB_002dd26e:
      return (int)CONCAT71((int7)((ulong)pVVar10 >> 8),local_39);
    }
  } while( true );
}

Assistant:

bool AddForm::verify(Varnode *h,Varnode *l,PcodeOp *op)

{
  hi1 = h;
  lo1 = l;
  slot1 = op->getSlot(hi1);
  for(int4 i=0;i<3;++i) {
    if (i==0) {		// Assume we have to descend one more add
      add2 = op->getOut()->loneDescend();
      if (add2 == (PcodeOp *)0) continue;
      if (add2->code() != CPUI_INT_ADD) continue;
      reshi = add2->getOut();
      hizext1 = op->getIn(1-slot1);
      hizext2 = add2->getIn(1-add2->getSlot(op->getOut()));
    }
    else if (i==1) {		// Assume we are at the bottom most of two adds
      Varnode *tmpvn = op->getIn(1-slot1);
      if (!tmpvn->isWritten()) continue;
      add2 = tmpvn->getDef();
      if (add2->code() != CPUI_INT_ADD) continue;
      reshi = op->getOut();
      hizext1 = add2->getIn(0);
      hizext2 = add2->getIn(1);
    }
    else {			// Assume there is only one add, with second implied add by 0
      reshi = op->getOut();
      hizext1 = op->getIn(1-slot1);
      hizext2 = (Varnode *)0;
    }
    for(int4 j=0;j<2;++j) {
      if (i==2) {		// hi2 is an implied 0
	if (!hizext1->isWritten()) continue;
	zextop = hizext1->getDef();
	hi2 = (Varnode *)0;
      }
      else if (j==0) {
	if (!hizext1->isWritten()) continue;
	zextop = hizext1->getDef();
	hi2 = hizext2;
      }
      else {
	if (!hizext2->isWritten()) continue;
	zextop = hizext2->getDef();
	hi2 = hizext1;
      }
      if (!checkForCarry(zextop)) continue; // Calculate lo2 and negconst

      list<PcodeOp *>::const_iterator iter2,enditer2;
      iter2 = lo1->beginDescend();
      enditer2 = lo1->endDescend();
      while(iter2 != enditer2) {
	loadd = *iter2;
	++iter2;
	if (loadd->code() != CPUI_INT_ADD) continue;
	Varnode *tmpvn = loadd->getIn(1-loadd->getSlot(lo1));
	if (lo2 == (Varnode *)0) {
	  if (!tmpvn->isConstant()) continue;
	  if (tmpvn->getOffset() != negconst) continue;	// Must add same constant used to calculate CARRY
	  lo2 = tmpvn;
	}
	else if (lo2->isConstant()) {
	  if (!tmpvn->isConstant()) continue;
	  if (lo2->getOffset() != tmpvn->getOffset()) continue;
	}
	else if (loadd->getIn(1-loadd->getSlot(lo1)) != lo2) // Must add same value used to calculate CARRY
	  continue;
	reslo = loadd->getOut();
	return true;
      }
    }
  }
  return false;
}